

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

pair<bool,_int> Fixpp::impl::matchTag<Fixpp::TagT<9u,Fixpp::Type::Int>,int>(StreamCursor *cursor)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  pair<bool,_int> pVar9;
  char *pcVar10;
  size_t sVar11;
  size_t count;
  StreamBuf<char> *pSVar12;
  int iVar13;
  long lVar14;
  uint local_34 [2];
  int ret;
  
  pSVar12 = cursor->buf;
  uVar1 = *(undefined8 *)&pSVar12->field_0x8;
  lVar2 = *(long *)&pSVar12->field_0x10;
  lVar3 = *(long *)&pSVar12->field_0x18;
  lVar7 = lVar3;
  lVar14 = lVar2;
  if (lVar3 == lVar2) {
    lVar7 = (**(code **)(*(long *)pSVar12 + 0x38))();
    if (lVar7 == 0) goto LAB_00401139;
    pSVar12 = cursor->buf;
    lVar7 = *(long *)&pSVar12->field_0x18;
    lVar14 = *(long *)&pSVar12->field_0x10;
  }
  sVar6 = lVar7 - lVar14;
  if (sVar6 == 0) {
    sVar6 = (**(code **)(*(long *)pSVar12 + 0x38))();
  }
  sVar11 = 0;
  iVar13 = 0;
  do {
    count = sVar11;
    if (9 < (byte)(*(byte *)(lVar14 + sVar11) - 0x30)) break;
    iVar13 = (uint)*(byte *)(lVar14 + sVar11) + iVar13 * 10 + -0x30;
    sVar11 = sVar11 + 1;
    count = sVar6;
  } while (sVar6 != sVar11);
  if ((count != 0) && (StreamCursor::advance(cursor,count), iVar13 == 9)) {
    pSVar12 = cursor->buf;
    pcVar8 = *(char **)&pSVar12->field_0x10;
    pcVar10 = *(char **)&pSVar12->field_0x18;
    if (pcVar10 == pcVar8) {
      lVar7 = (**(code **)(*(long *)pSVar12 + 0x38))();
      if (lVar7 == 0) goto LAB_00401139;
      pSVar12 = cursor->buf;
      pcVar8 = *(char **)&pSVar12->field_0x10;
      pcVar10 = *(char **)&pSVar12->field_0x18;
    }
    if (pcVar8 < pcVar10) {
      cVar5 = *pcVar8;
    }
    else {
      cVar5 = (**(code **)(*(long *)pSVar12 + 0x48))();
    }
    if (cVar5 == '=') {
      StreamCursor::advance(cursor,1);
      bVar4 = TagMatcher<Fixpp::Type::Int>::matchValue((Return *)local_34,cursor);
      if (bVar4) {
        return (pair<bool,_int>)(((ulong)local_34[0] << 0x20) + 1);
      }
    }
  }
LAB_00401139:
  pSVar12 = cursor->buf;
  *(undefined8 *)&pSVar12->field_0x8 = uVar1;
  *(long *)&pSVar12->field_0x10 = lVar2;
  *(long *)&pSVar12->field_0x18 = lVar3;
  pVar9.first = false;
  pVar9._1_3_ = 0;
  pVar9.second = 0;
  return pVar9;
}

Assistant:

std::pair<bool, Ret> matchTag(StreamCursor& cursor)
        {
            #define TRY_MATCH(...) \
            if (!__VA_ARGS__) \
               return std::make_pair(false, Ret {})

            StreamCursor::Revert revert(cursor);

            int tag;
            TRY_MATCH(match_int_fast(&tag, cursor));

            if (tag != Tag::Id)
               return std::make_pair(false, Ret {});

            TRY_MATCH(match_literal_fast('=', cursor));

            Ret ret;

            TRY_MATCH(TagMatcher<typename Tag::Type>::matchValue(&ret, cursor));

            revert.ignore();

            return std::make_pair(true, ret);

            #undef TRY_MATCH
        }